

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyModule.cpp
# Opt level: O3

Var Js::WebAssemblyModule::EntryImports(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Var pvVar5;
  WebAssemblyModule *this;
  WasmImport *pWVar6;
  JavascriptString *newValue;
  JavascriptString *newValue_00;
  Var instance;
  uint32 i;
  int in_stack_00000010;
  undefined1 local_68 [8];
  ArgumentReader args;
  CallInfo local_38;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_38 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyModule.cpp"
                                ,0x72,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00d8d15e;
    *puVar4 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_68 = (undefined1  [8])callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)local_68,&local_38);
  if (((ulong)local_68 & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyModule.cpp"
                                ,0x73,"(args.Info.Count > 0)","Should always have implicit \'this\'"
                               );
    if (!bVar3) goto LAB_00d8d15e;
    *puVar4 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)local_38 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyModule.cpp"
                                ,0x76,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00d8d15e:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  if (((ulong)local_68 & 0xfffffe) != 0) {
    pvVar5 = Arguments::operator[]((Arguments *)local_68,1);
    bVar3 = VarIs<Js::WebAssemblyModule>(pvVar5);
    if (bVar3) {
      pvVar5 = Arguments::operator[]((Arguments *)local_68,1);
      this = VarTo<Js::WebAssemblyModule>(pvVar5);
      pvVar5 = JavascriptOperators::NewJavascriptArrayNoArg(pSVar1);
      if ((((this->m_imports).ptr)->
          super_ReadOnlyList<Wasm::WasmImport_*,_Memory::ArenaAllocator,_DefaultComparer>).count !=
          0) {
        i = 0;
        do {
          pWVar6 = GetImport(this,i);
          newValue = GetExternalKindString(pSVar1,pWVar6->kind);
          newValue_00 = JavascriptString::NewCopySz(pWVar6->modName,pSVar1);
          args.super_Arguments.Values = (Type)JavascriptString::NewCopySz(pWVar6->importName,pSVar1)
          ;
          instance = JavascriptOperators::NewJavascriptObjectNoArg(pSVar1);
          JavascriptOperators::OP_SetProperty
                    (instance,0xe7,newValue,pSVar1,(PropertyValueInfo *)0x0,PropertyOperation_None,
                     (Var)0x0);
          JavascriptOperators::OP_SetProperty
                    (instance,0xe5,newValue_00,pSVar1,(PropertyValueInfo *)0x0,
                     PropertyOperation_None,(Var)0x0);
          JavascriptOperators::OP_SetProperty
                    (instance,0x106,args.super_Arguments.Values,pSVar1,(PropertyValueInfo *)0x0,
                     PropertyOperation_None,(Var)0x0);
          JavascriptArray::Push(pSVar1,pvVar5,instance);
          i = i + 1;
        } while (i < (uint)(((this->m_imports).ptr)->
                           super_ReadOnlyList<Wasm::WasmImport_*,_Memory::ArenaAllocator,_DefaultComparer>
                           ).count);
      }
      return pvVar5;
    }
  }
  JavascriptError::ThrowTypeError(pSVar1,-0x7ff5e4a5,(PCWSTR)0x0);
}

Assistant:

Var
WebAssemblyModule::EntryImports(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
    ScriptContext* scriptContext = function->GetScriptContext();

    Assert(!(callInfo.Flags & CallFlags_New));

    if (args.Info.Count < 2 || !VarIs<WebAssemblyModule>(args[1]))
    {
        JavascriptError::ThrowTypeError(scriptContext, WASMERR_NeedModule);
    }

    WebAssemblyModule * module = VarTo<WebAssemblyModule>(args[1]);

    Var importArray = JavascriptOperators::NewJavascriptArrayNoArg(scriptContext);
    for (uint32 i = 0; i < module->GetImportCount(); ++i)
    {
        Wasm::WasmImport * import = module->GetImport(i);
        Js::JavascriptString * kind = GetExternalKindString(scriptContext, import->kind);
        Js::JavascriptString * moduleName = JavascriptString::NewCopySz(import->modName, scriptContext);
        Js::JavascriptString * name = JavascriptString::NewCopySz(import->importName, scriptContext);

        Var pair = JavascriptOperators::NewJavascriptObjectNoArg(scriptContext);
        JavascriptOperators::OP_SetProperty(pair, PropertyIds::kind, kind, scriptContext);
        JavascriptOperators::OP_SetProperty(pair, PropertyIds::module, moduleName, scriptContext);
        JavascriptOperators::OP_SetProperty(pair, PropertyIds::name, name, scriptContext);
        JavascriptArray::Push(scriptContext, importArray, pair);
    }

    return importArray;
}